

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::EndDeadOpHelperLifetimes(LinearScan *this,Instr *instr)

{
  uint uVar1;
  Type pLVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  uint32 uVar6;
  Type *ppLVar7;
  undefined4 *puVar8;
  Lifetime *deadLifetime;
  Instr *instr_local;
  LinearScan *this_local;
  
  bVar4 = SkipNumberedInstr(this,instr);
  if (!bVar4) {
    while( true ) {
      bVar5 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Empty
                        (&this->opHelperSpilledLiveranges->
                          super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
      bVar4 = false;
      if (!bVar5) {
        ppLVar7 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                            (&this->opHelperSpilledLiveranges->
                              super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
        uVar1 = (*ppLVar7)->end;
        uVar6 = IR::Instr::GetNumber(instr);
        bVar4 = uVar1 <= uVar6;
      }
      if (!bVar4) break;
      bVar4 = IsInHelperBlock(this);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x989,"(this->IsInHelperBlock())","this->IsInHelperBlock()");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
      }
      ppLVar7 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this->opHelperSpilledLiveranges->
                            super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
      pLVar2 = *ppLVar7;
      SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                (this->opHelperSpilledLiveranges);
      if ((*(ushort *)&pLVar2->field_0x9c >> 6 & 1) == 0) {
        BVUnitT<unsigned_long>::Clear(&this->opHelperSpilledRegs,(uint)pLVar2->reg);
      }
      *(ushort *)&pLVar2->field_0x9c = *(ushort *)&pLVar2->field_0x9c & 0xffef;
      *(ushort *)&pLVar2->field_0x9c = *(ushort *)&pLVar2->field_0x9c & 0xffbf;
      *(ushort *)&pLVar2->field_0x9c = *(ushort *)&pLVar2->field_0x9c & 0xffdf;
    }
  }
  return;
}

Assistant:

void
LinearScan::EndDeadOpHelperLifetimes(IR::Instr * instr)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    while (!this->opHelperSpilledLiveranges->Empty() &&
           this->opHelperSpilledLiveranges->Head()->end <= instr->GetNumber())
    {
        Lifetime * deadLifetime;

        // The lifetime doesn't extend beyond the helper block
        // No need to save and restore around the helper block
        Assert(this->IsInHelperBlock());

        deadLifetime = this->opHelperSpilledLiveranges->Head();
        this->opHelperSpilledLiveranges->RemoveHead();
        if (!deadLifetime->cantOpHelperSpill)
        {
            this->opHelperSpilledRegs.Clear(deadLifetime->reg);
        }
        deadLifetime->isOpHelperSpilled = false;
        deadLifetime->cantOpHelperSpill = false;
        deadLifetime->isOpHelperSpillAsArg = false;
    }
}